

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# console.cpp
# Opt level: O1

bool __thiscall CConsole::NextParam(CConsole *this,char *pNext,char **pFormat)

{
  char *pcVar1;
  int iVar2;
  char *pcVar3;
  
  pcVar3 = *pFormat;
  if (*pcVar3 != '\0') {
    *pFormat = pcVar3 + 1;
    if (pcVar3[1] == '[') {
      iVar2 = str_span(pcVar3 + 1,"]");
      pcVar1 = *pFormat;
      pcVar3 = pcVar1 + iVar2;
      *pFormat = pcVar3;
      if (pcVar1[iVar2] == '\0') {
        return true;
      }
      *pFormat = pcVar3 + 1;
    }
    pcVar3 = str_skip_whitespaces_const(*pFormat);
    *pFormat = pcVar3;
  }
  *pNext = **pFormat;
  return false;
}

Assistant:

bool CConsole::NextParam(char *pNext, const char *&pFormat)
{
	if(*pFormat)
	{
		pFormat++;

		if(*pFormat == '[')
		{
			// skip bracket contents
			pFormat += str_span(pFormat, "]");
			if(!*pFormat)
				return true;

			// skip ']'
			pFormat++;
		}

		// skip space if there is one
		pFormat = str_skip_whitespaces_const(pFormat);
	}
	*pNext = *pFormat;
	return false;
}